

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O3

uint32_t * __thiscall sha1::SHA1::getDigest(SHA1 *this,uint32_t *digest)

{
  ulong uVar1;
  undefined8 uVar2;
  
  uVar1 = this->m_byteCount;
  processByte(this,0x80);
  if (this->m_blockByteIndex < 0x39) {
    if (this->m_blockByteIndex != 0x38) {
      do {
        processByte(this,'\0');
      } while (this->m_blockByteIndex < 0x38);
    }
  }
  else {
    do {
      processByte(this,'\0');
    } while (this->m_blockByteIndex != 0);
    do {
      processByte(this,'\0');
    } while (this->m_blockByteIndex < 0x38);
  }
  processByte(this,'\0');
  processByte(this,'\0');
  processByte(this,'\0');
  processByte(this,'\0');
  processByte(this,(uint8_t)(uVar1 >> 0x15));
  processByte(this,(uint8_t)(uVar1 >> 0xd));
  processByte(this,(uint8_t)(uVar1 >> 5));
  processByte(this,(char)uVar1 * '\b');
  uVar2 = *(undefined8 *)(this->m_digest + 2);
  *(undefined8 *)digest = *(undefined8 *)this->m_digest;
  *(undefined8 *)(digest + 2) = uVar2;
  digest[4] = this->m_digest[4];
  return digest;
}

Assistant:

const uint32_t *getDigest(digest32_t digest) {
    size_t bitCount = this->m_byteCount * 8;
    processByte(0x80);
    if (this->m_blockByteIndex > 56) {
      while (m_blockByteIndex != 0) {
        processByte(0);
      }
      while (m_blockByteIndex < 56) {
        processByte(0);
      }
    } else {
      while (m_blockByteIndex < 56) {
        processByte(0);
      }
    }
    processByte(0);
    processByte(0);
    processByte(0);
    processByte(0);
    processByte(static_cast<unsigned char>((bitCount >> 24) & 0xFF));
    processByte(static_cast<unsigned char>((bitCount >> 16) & 0xFF));
    processByte(static_cast<unsigned char>((bitCount >> 8) & 0xFF));
    processByte(static_cast<unsigned char>((bitCount)&0xFF));

    memcpy(digest, m_digest, 5 * sizeof(uint32_t));
    return digest;
  }